

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

void __thiscall TypeFactory::clear(TypeFactory *this)

{
  bool bVar1;
  reference ppDVar2;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<Datatype_*> local_18;
  iterator iter;
  TypeFactory *this_local;
  
  iter._M_node = (_Base_ptr)this;
  std::_Rb_tree_const_iterator<Datatype_*>::_Rb_tree_const_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::set<Datatype_*,_DatatypeCompare,_std::allocator<Datatype_*>_>::begin(&this->tree);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<Datatype_*,_DatatypeCompare,_std::allocator<Datatype_*>_>::end(&this->tree);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppDVar2 = std::_Rb_tree_const_iterator<Datatype_*>::operator*(&local_18);
    if (*ppDVar2 != (Datatype *)0x0) {
      (*(*ppDVar2)->_vptr_Datatype[2])();
    }
    std::_Rb_tree_const_iterator<Datatype_*>::operator++(&local_18);
  }
  std::set<Datatype_*,_DatatypeCompare,_std::allocator<Datatype_*>_>::clear(&this->tree);
  std::set<Datatype_*,_DatatypeNameCompare,_std::allocator<Datatype_*>_>::clear(&this->nametree);
  clearCache(this);
  return;
}

Assistant:

void TypeFactory::clear(void)

{
  DatatypeSet::iterator iter;

  for(iter=tree.begin();iter!=tree.end();++iter)
    delete *iter;
  tree.clear();
  nametree.clear();
  clearCache();
}